

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armci.c
# Opt level: O0

int PARMCI_Init_args(int *argc,char ***argv)

{
  int iVar1;
  int *in_RSI;
  MPI_Comm *in_RDI;
  int rc;
  MPI_Comm in_stack_00000140;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  iVar1 = comex_init_args(in_RSI,(char ***)
                                 CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  if (iVar1 != 0) {
    __assert_fail("COMEX_SUCCESS == rc",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/armci.c"
                  ,0x1a2,"int PARMCI_Init_args(int *, char ***)");
  }
  iVar1 = comex_group_comm(rc,in_RDI);
  if (iVar1 == 0) {
    armci_init_domains(in_stack_00000140);
    ARMCI_Default_Proc_Group = 0;
    return iVar1;
  }
  __assert_fail("COMEX_SUCCESS == rc",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/armci.c"
                ,0x1a4,"int PARMCI_Init_args(int *, char ***)");
}

Assistant:

int PARMCI_Init_args(int *argc, char ***argv)
{
    int rc = comex_init_args(argc, argv);
    assert(COMEX_SUCCESS == rc);
    rc = comex_group_comm(COMEX_GROUP_WORLD, &ARMCI_COMM_WORLD);
    assert(COMEX_SUCCESS == rc);
    armci_init_domains(ARMCI_COMM_WORLD);
    ARMCI_Default_Proc_Group = 0;
    return rc;
}